

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<CLI::App_*const_&,_CLI::App_*const_&> * __thiscall
Catch::ExprLhs<CLI::App*const&>::operator==
          (BinaryExpr<CLI::App_*const_&,_CLI::App_*const_&> *__return_storage_ptr__,
          ExprLhs<CLI::App*const&> *this,App **rhs)

{
  App **ppAVar1;
  App *pAVar2;
  App *pAVar3;
  StringRef local_40;
  
  ppAVar1 = *(App ***)this;
  pAVar2 = *ppAVar1;
  pAVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = pAVar2 == pAVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00245e68;
  __return_storage_ptr__->m_lhs = ppAVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }